

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O0

void __thiscall CTcTokString::append(CTcTokString *this,char *p,size_t len)

{
  size_t in_RDX;
  void *in_RSI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x10))(in_RDI,in_RDI[3] + in_RDX);
  memcpy((void *)(in_RDI[1] + in_RDI[3]),in_RSI,in_RDX);
  in_RDI[3] = in_RDX + in_RDI[3];
  *(undefined1 *)(in_RDI[1] + in_RDI[3]) = 0;
  return;
}

Assistant:

virtual void append(const char *p, size_t len)
    {
        /* make sure we have space available */
        ensure_space(buf_len_ + len);

        /* copy the text onto the end of our buffer */
        memcpy(buf_ + buf_len_, p, len);

        /* add it to the length of the text */
        buf_len_ += len;

        /* null-terminte it */
        buf_[buf_len_] = '\0';
    }